

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_normal *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  string *psVar1;
  _Base_ptr __k;
  bool bVar2;
  __type _Var3;
  int iVar4;
  value_type *value;
  ostream *poVar5;
  size_type sVar6;
  mapped_type *this;
  _Base_ptr p_Var7;
  UsdPrimvarReader_normal *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  char *pcVar8;
  Property *args_1;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa18;
  allocator local_5da;
  char local_5d9;
  UsdPrimvarReader_normal *local_5d8;
  allocator local_5c9;
  string *local_5c8;
  _Base_ptr local_5c0;
  UsdPrimvarReader_normal *local_5b8;
  ParseResult ret;
  undefined1 local_580 [40];
  Property *local_558;
  _Base_ptr local_550;
  string attr_type_name;
  key_type local_520;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  string local_488 [32];
  ostringstream ss_e_1;
  undefined1 local_460 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450 [22];
  string local_2f0 [32];
  string local_2d0;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> av;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args = preader;
  args_1 = (Property *)warn;
  local_5c8 = err;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::__cxx11::string::string((string *)&av,"info:id",(allocator *)&ss_e_1);
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&av);
  ::std::__cxx11::string::_M_dispose();
  local_550 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_558 = (Property *)&preader->varname;
  local_580._32_8_ = &preader->result;
  local_5b8 = preader;
  for (p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var7 != local_550;
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7)) {
    local_5c0 = p_Var7 + 1;
    ::std::__cxx11::string::string((string *)&local_4a8,(string *)local_5c0);
    local_5d8 = (UsdPrimvarReader_normal *)(p_Var7 + 2);
    ::std::__cxx11::string::string((string *)local_580,"inputs:fallback",(allocator *)&local_520);
    ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
    ret.err._M_string_length = 0;
    ret.err.field_2._M_local_buf[0] = '\0';
    iVar4 = ::std::__cxx11::string::compare((string *)&local_4a8);
    if (iVar4 == 0) {
      if (((ulong)p_Var7[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
        ret.code = PropertyTypeMismatch;
        ::std::__cxx11::string::string
                  ((string *)&ss_e_1,
                   "Property `{}` must be Attribute, but declared as Relationship.",
                   (allocator *)&attr_type_name);
        fmt::format<std::__cxx11::string>
                  ((string *)&av,(fmt *)&ss_e_1,(string *)local_580,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&av);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      if (p_Var7[6]._M_left != p_Var7[6]._M_parent) {
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &(preader->fallback)._paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&p_Var7[6]._M_parent);
        ret.code = Success;
      }
      Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)local_5d8);
      tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&av,&attr_type_name);
      if (_Var3) {
        ::std::__cxx11::string::_M_dispose();
LAB_001d1217:
        iVar4 = *(int *)((long)&p_Var7[0x17]._M_parent + 4);
        if (iVar4 == 1) {
          bVar2 = Attribute::is_blocked((Attribute *)local_5d8);
          if (bVar2) {
            (local_5b8->fallback)._blocked = true;
          }
          bVar2 = primvar::PrimVar::has_value((PrimVar *)&p_Var7[4]._M_parent);
          if ((bVar2) || (p_Var7[5]._M_left != p_Var7[5]._M_parent)) {
            anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
                      ((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&ss_e_1,
                       (PrimVar *)&p_Var7[4]._M_parent);
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
            optional<tinyusdz::Animatable<tinyusdz::value::normal3f>,_0>
                      (&av,(optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&ss_e_1);
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
            ~optional((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)&ss_e_1);
            bVar2 = av.has_value_;
            if (av.has_value_ == true) {
              value = nonstd::optional_lite::
                      optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::value(&av);
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::
              operator=((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *)
                        &(preader->fallback)._attrib,value);
            }
            else {
              ret.code = InternalError;
              ::std::__cxx11::string::assign((char *)&ret.err);
            }
            nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::
            ~optional(&av);
            if (bVar2 != false) goto LAB_001d13d2;
          }
          else if (p_Var7[6]._M_left != p_Var7[6]._M_parent) {
            AttrMetas::operator=(&(preader->fallback)._metas,(AttrMetas *)(p_Var7 + 7));
            __v = &local_4a8;
            goto LAB_001d13ef;
          }
        }
        else if (iVar4 == 0) {
          (local_5b8->fallback)._value_empty = true;
LAB_001d13d2:
          __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580;
          AttrMetas::operator=(&(preader->fallback)._metas,(AttrMetas *)(p_Var7 + 7));
LAB_001d13ef:
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&table,__v);
          ret.code = Success;
        }
        else {
          ::std::__cxx11::string::assign((char *)&ret.err);
          ret.code = InternalError;
        }
      }
      else {
        tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
        _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss_e_1,&attr_type_name);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (_Var3) goto LAB_001d1217;
        ret.code = TypeMismatch;
        ::std::__cxx11::stringstream::stringstream((stringstream *)&av);
        poVar5 = ::std::operator<<((ostream *)((long)&av.contained + 8),"Property type mismatch. ");
        poVar5 = ::std::operator<<(poVar5,(string *)local_580);
        poVar5 = ::std::operator<<(poVar5," expects type `");
        tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
        poVar5 = ::std::operator<<(poVar5,(string *)&ss_e_1);
        poVar5 = ::std::operator<<(poVar5,"` but defined as type `");
        poVar5 = ::std::operator<<(poVar5,(string *)&attr_type_name);
        ::std::operator<<(poVar5,"`");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e_1);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&av);
      }
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ret.code = Unmatched;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    iVar4 = 0;
    if ((ret.code & ~AlreadyProcessed) == Success) {
      iVar4 = 3;
LAB_001d1559:
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (ret.code != Unmatched) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar5 = ::std::operator<<((ostream *)&av,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x119a);
        ::std::operator<<(poVar5," ");
        ::std::__cxx11::string::string
                  ((string *)&attr_type_name,"Parsing attribute `{}` failed. Error: {}",
                   (allocator *)local_580);
        args = (UsdPrimvarReader_normal *)&ret.err;
        fmt::format<char[16],std::__cxx11::string>
                  ((string *)&ss_e_1,(fmt *)&attr_type_name,(string *)"inputs:fallback",
                   (char (*) [16])args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        poVar5 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        psVar1 = local_5c8;
        if (local_5c8 != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&attr_type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar1);
          ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
        iVar4 = 1;
        goto LAB_001d1559;
      }
    }
    ::std::__cxx11::string::_M_dispose();
    if (bVar2) {
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_5c0,"inputs:varname");
      if (bVar2) {
        ::std::__cxx11::string::string((string *)&av,"inputs:varname",(allocator *)&ss_e_1);
        sVar6 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,(key_type *)&av);
        ::std::__cxx11::string::_M_dispose();
        if (sVar6 == 0) {
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::string((string *)&local_2d0,(string *)local_5c0);
          ::std::__cxx11::string::string
                    ((string *)&ss_e_1,"inputs:varname",(allocator *)&attr_type_name);
          args = local_5d8;
          args_1 = (Property *)&ss_e_1;
          err = (string *)&av;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    (&ret,&table,&local_2d0,(Property *)local_5d8,(string *)&ss_e_1,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          if (ret.code == TypeMismatch) {
            ::std::__cxx11::string::string(local_2f0,(string *)local_5c0);
            ::std::__cxx11::string::string
                      ((string *)&ss_e_1,"inputs:varname",(allocator *)local_580);
            args = local_5d8;
            args_1 = (Property *)&ss_e_1;
            err = (string *)local_558;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)&attr_type_name,(_anonymous_namespace_ *)&table,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2f0,(string *)local_5d8,(Property *)&ss_e_1,(string *)local_558,
                       in_stack_fffffffffffffa18);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            iVar4 = 3;
            if ((int)attr_type_name._M_dataplus._M_p != 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
              poVar5 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x11b3);
              ::std::operator<<(poVar5," ");
              ::std::__cxx11::string::string
                        ((string *)&local_520,"Faied to parse inputs:varname: {}",&local_5da);
              fmt::format<std::__cxx11::string>
                        ((string *)local_580,(fmt *)&local_520,
                         (string *)&attr_type_name._M_string_length,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar5 = ::std::operator<<((ostream *)&ss_e_1,(string *)local_580);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              psVar1 = local_5c8;
              if (local_5c8 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((string *)local_580,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_520,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)psVar1);
                ::std::__cxx11::string::operator=((string *)psVar1,(string *)local_580);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
              iVar4 = 1;
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            iVar4 = 0;
            if (ret.code == Success) {
              bVar2 = ConvertTokenAttributeToStringAttribute
                                ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av,
                                 (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_558);
              iVar4 = 3;
              if (!bVar2) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e_1);
                poVar5 = ::std::operator<<((ostream *)&ss_e_1,"[error]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x11a1);
                ::std::operator<<(poVar5," ");
                poVar5 = ::std::operator<<((ostream *)&ss_e_1,
                                           "Failed to convert inputs:varname token type to string type."
                                          );
                ::std::operator<<(poVar5,"\n");
                psVar1 = local_5c8;
                if (local_5c8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&attr_type_name,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_580,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)psVar1);
                  ::std::__cxx11::string::operator=((string *)psVar1,(string *)&attr_type_name);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e_1);
                iVar4 = 1;
              }
            }
          }
          ::std::__cxx11::string::_M_dispose();
          TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_>::~TypedAttribute
                    ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&av);
          if (iVar4 != 0) goto LAB_001d1e92;
        }
      }
      ::std::__cxx11::string::string(local_488,(string *)local_5c0);
      ::std::__cxx11::string::string((string *)&local_520,"outputs:result",&local_5c9);
      local_460._0_8_ = local_450;
      local_460._8_8_ = 0;
      local_450[0]._M_local_buf[0] = '\0';
      iVar4 = ::std::__cxx11::string::compare(local_488);
      if (iVar4 == 0) {
        sVar6 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&table,&local_520);
        if (sVar6 == 0) {
          bVar2 = Property::is_attribute_connection((Property *)local_5d8);
          if (bVar2) {
            _ss_e_1 = 5;
            ::std::__cxx11::string::assign(local_460);
          }
          else if (*(int *)((long)&p_Var7[0x17]._M_parent + 4) == 0) {
            Attribute::type_name_abi_cxx11_((string *)&av,(Attribute *)local_5d8);
            local_5d9 = tinyusdz::value::IsRoleType((string *)&av);
            tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
            _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&av);
            ::std::__cxx11::string::_M_dispose();
            if (_Var3) {
              (local_5b8->result)._authored = true;
LAB_001d1ab3:
              AttrMetas::operator=((AttrMetas *)local_580._32_8_,(AttrMetas *)(p_Var7 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,&local_520);
              _ss_e_1 = 0;
            }
            else {
              if (local_5d9 == '\0') {
                tinyusdz::value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
                _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&ret,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&av);
                ::std::__cxx11::string::_M_dispose();
                if (_Var3) {
                  (local_5b8->result)._authored = true;
                  ::std::__cxx11::string::_M_assign((string *)&(preader->result)._actual_type_name);
                  goto LAB_001d1ab3;
                }
                pcVar8 = 
                "Attribute type mismatch. {} expects type `{}`(and its underlying types) but defined as type `{}`."
                ;
              }
              else {
                pcVar8 = "Attribute type mismatch. {} expects type `{}` but defined as type `{}`.";
              }
              _ss_e_1 = 3;
              ::std::__cxx11::string::string((string *)&attr_type_name,pcVar8,&local_5da);
              args = (UsdPrimvarReader_normal *)local_580;
              tinyusdz::value::TypeTraits<tinyusdz::value::normal3f>::type_name_abi_cxx11_();
              args_1 = (Property *)&av;
              fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        ((string *)&ret,(fmt *)&attr_type_name,&local_520,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&av,
                         err);
              ::std::__cxx11::string::operator=((string *)local_460,(string *)&ret);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            ::std::__cxx11::string::assign(local_460);
            _ss_e_1 = 6;
          }
        }
        else {
          _ss_e_1 = 2;
        }
      }
      else {
        _ss_e_1 = 1;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar4 = 0;
      if ((_ss_e_1 & 0xfffffffd) == 0) {
        iVar4 = 3;
LAB_001d1d2d:
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (_ss_e_1 != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
          poVar5 = ::std::operator<<((ostream *)&av,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x11b9);
          ::std::operator<<(poVar5," ");
          ::std::__cxx11::string::string
                    ((string *)&attr_type_name,
                     "Parsing shader output property `{}` failed. Error: {}",(allocator *)local_580)
          ;
          args = (UsdPrimvarReader_normal *)local_460;
          fmt::format<char[15],std::__cxx11::string>
                    ((string *)&ret,(fmt *)&attr_type_name,(string *)"outputs:result",
                     (char (*) [15])args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar5 = ::std::operator<<((ostream *)&av,(string *)&ret);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar1 = local_5c8;
          if (local_5c8 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&attr_type_name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar1);
            ::std::__cxx11::string::operator=((string *)psVar1,(string *)&ret);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
          iVar4 = 1;
          goto LAB_001d1d2d;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      __k = local_5c0;
      if (!bVar2) goto LAB_001d1e92;
      sVar6 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)local_5c0);
      if (sVar6 == 0) {
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&(preader->super_ShaderNode).super_UsdShadePrim.props,(key_type *)__k);
        Property::operator=(this,(Property *)local_5d8);
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&table,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
      }
      sVar6 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&table,(key_type *)__k);
      if (sVar6 == 0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&av);
        poVar5 = ::std::operator<<((ostream *)&av,"[warn]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x11bb);
        ::std::operator<<(poVar5," ");
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &ss_e_1,"Unsupported/unimplemented property: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        poVar5 = ::std::operator<<((ostream *)&av,(string *)&ss_e_1);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::_M_dispose();
        if (warn != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ss_e_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5c8);
          ::std::__cxx11::string::operator=((string *)warn,(string *)&ss_e_1);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&av);
      }
    }
    else {
LAB_001d1e92:
      if ((iVar4 != 3) && (iVar4 != 0)) break;
    }
  }
  bVar2 = p_Var7 == local_550;
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar2;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_normal>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_normal *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_normal,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_normal, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_normal, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}